

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::XMLText::ParseDeep(XMLText *this,char *p,StrPair *param_2)

{
  char *pcVar1;
  XMLDocument *pXVar2;
  
  if (this->_isCData == true) {
    pcVar1 = StrPair::ParseText(&(this->super_XMLNode)._value,p,"]]>",2);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
    pXVar2 = (this->super_XMLNode)._document;
    pXVar2->_errorID = XML_ERROR_PARSING_CDATA;
  }
  else {
    pXVar2 = (this->super_XMLNode)._document;
    pcVar1 = StrPair::ParseText(&(this->super_XMLNode)._value,p,"<",
                                (uint)pXVar2->_processEntities +
                                (uint)(pXVar2->_whitespace == COLLAPSE_WHITESPACE) * 4 + 2);
    if (pcVar1 != (char *)0x0) {
      if (*pcVar1 == '\0') {
        return (char *)0x0;
      }
      return pcVar1 + -1;
    }
    pXVar2 = (this->super_XMLNode)._document;
    pXVar2->_errorID = XML_ERROR_PARSING_TEXT;
  }
  pXVar2->_errorStr1 = p;
  pXVar2->_errorStr2 = (char *)0x0;
  return (char *)0x0;
}

Assistant:

char* XMLText::ParseDeep( char* p, StrPair* )
{
    const char* start = p;
    if ( this->CData() ) {
        p = _value.ParseText( p, "]]>", StrPair::NEEDS_NEWLINE_NORMALIZATION );
        if ( !p ) {
            _document->SetError( XML_ERROR_PARSING_CDATA, start, 0 );
        }
        return p;
    }
    else {
        int flags = _document->ProcessEntities() ? StrPair::TEXT_ELEMENT : StrPair::TEXT_ELEMENT_LEAVE_ENTITIES;
        if ( _document->WhitespaceMode() == COLLAPSE_WHITESPACE ) {
            flags |= StrPair::NEEDS_WHITESPACE_COLLAPSING;
        }

        p = _value.ParseText( p, "<", flags );
        if ( p && *p ) {
            return p-1;
        }
        if ( !p ) {
            _document->SetError( XML_ERROR_PARSING_TEXT, start, 0 );
        }
    }
    return 0;
}